

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fepoll.cpp
# Opt level: O3

int __thiscall fepoll::del_event(fepoll *this,iobject *object,socket_t fd,int events)

{
  int iVar1;
  uint uVar2;
  epoll_event event;
  uint local_1c;
  iobject *local_18;
  
  uVar2 = ~events & object->events_;
  local_1c = uVar2;
  local_18 = object;
  iVar1 = epoll_ctl(this->epfd_,uVar2 == 0 ^ 3,fd,(epoll_event *)&local_1c);
  if (iVar1 == 0) {
    object->events_ = uVar2;
  }
  return iVar1;
}

Assistant:

int fepoll::del_event(iobject* object, socket_t fd, int events)
{
    int exists = object->get_events();
    int newevs = exists & (~events);
    int op = (newevs == 0) ? EPOLL_CTL_DEL : EPOLL_CTL_MOD;

    epoll_event event;
    event.data.ptr = object;
    event.events = newevs;
    int ret = epoll_ctl(epfd_, op, fd, &event);
    if (ret != 0) {
        return ret;
    }

    object->set_events(newevs);
    return 0;
}